

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_util.c
# Opt level: O0

int ExUtilReadFileToWebPData(char *filename,WebPData *webp_data)

{
  undefined8 *in_RSI;
  size_t size;
  uint8_t *data;
  undefined8 local_28;
  undefined8 local_20;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int iVar1;
  
  if (in_RSI == (undefined8 *)0x0) {
    iVar1 = 0;
  }
  else {
    iVar1 = ImgIoUtilReadFile((char *)data,(uint8_t **)size,
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (iVar1 == 0) {
      iVar1 = 0;
    }
    else {
      *in_RSI = local_20;
      in_RSI[1] = local_28;
      iVar1 = 1;
    }
  }
  return iVar1;
}

Assistant:

int ExUtilReadFileToWebPData(const char* const filename,
                             WebPData* const webp_data) {
  const uint8_t* data;
  size_t size;
  if (webp_data == NULL) return 0;
  if (!ImgIoUtilReadFile(filename, &data, &size)) return 0;
  webp_data->bytes = data;
  webp_data->size = size;
  return 1;
}